

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O0

ctemplate * __thiscall ctemplate::PathJoin(ctemplate *this,string *a,string *b)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *b_local;
  string *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = IsAbspath(local_20);
      if (bVar1) {
        std::__cxx11::string::string((string *)this,(string *)local_20);
      }
      else {
        bVar1 = IsDirectory(b_local);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         b_local);
        }
        else {
          std::operator+(local_40,(char)b_local);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         local_40);
          std::__cxx11::string::~string((string *)local_40);
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)this,(string *)local_20);
    }
  }
  else {
    std::__cxx11::string::string((string *)this,(string *)b_local);
  }
  return this;
}

Assistant:

string PathJoin(const string& a, const string& b) {
  if (b.empty()) return a;                        // degenerate case 1
  if (a.empty()) return b;                        // degenerate case 2
  if (IsAbspath(b)) return b;                     // absolute path
  if (IsDirectory(a)) return a + b;               // 'well-formed' case
  return a + PATH_SEP + b;
}